

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O3

void adios2::helper::HandshakeWriter
               (Comm *comm,size_t *appID,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *fullAddresses,string *name,string *engineName,int basePort,int channelsPerRank,
               int maxRanksPerNode,int maxAppsPerNode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  pointer *ppcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  unsigned_long uVar11;
  reference val;
  size_type *psVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  undefined8 uVar18;
  pointer pcVar19;
  json globalAddressesJson;
  string ip;
  string engineFilename;
  string engineLockFilename;
  string globalFilename;
  string globalLockFilename;
  json localAddressesJson;
  vector<char,_std::allocator<char>_> globalAddressesChar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FileFStream numWrite;
  string localAddressesStr;
  vector<char,_std::allocator<char>_> local_dd8;
  int local_db8;
  uint local_db4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_db0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d98;
  string local_d78;
  string local_d58;
  undefined1 *local_d38 [2];
  undefined1 local_d28 [16];
  string local_d18;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_cf8;
  _Any_data local_ce8;
  code *local_cd8;
  undefined8 uStack_cd0;
  vector<char,_std::allocator<char>_> local_cc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ca8;
  FileFStream local_c90;
  undefined1 local_978 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_960 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660 [24];
  string_t local_348 [24];
  
  local_db0 = fullAddresses;
  iVar8 = Comm::Rank(comm);
  local_db4 = Comm::Size(comm);
  local_d38[0] = local_d28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d38,".socket","");
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d18,".socket.lock","");
  local_978._0_8_ = local_978 + 0x10;
  pcVar5 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_978,pcVar5,pcVar5 + name->_M_string_length);
  std::__cxx11::string::append(local_978);
  plVar9 = (long *)std::__cxx11::string::_M_append(local_978,(ulong)(engineName->_M_dataplus)._M_p);
  local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_d78.field_2._M_allocated_capacity = *psVar12;
    local_d78.field_2._8_8_ = plVar9[3];
  }
  else {
    local_d78.field_2._M_allocated_capacity = *psVar12;
    local_d78._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_d78._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
    operator_delete((void *)local_978._0_8_);
  }
  local_c90.super_Transport._vptr_Transport =
       (_func_int **)&local_c90.super_Transport.m_Type._M_string_length;
  pcVar5 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c90,pcVar5,pcVar5 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_c90);
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&local_c90,(ulong)(engineName->_M_dataplus)._M_p);
  psVar12 = puVar10 + 2;
  if ((size_type *)*puVar10 == psVar12) {
    local_978._16_8_ = *psVar12;
    local_960[0]._0_8_ = puVar10[3];
    local_978._0_8_ = local_978 + 0x10;
  }
  else {
    local_978._16_8_ = *psVar12;
    local_978._0_8_ = (size_type *)*puVar10;
  }
  local_978._8_8_ = puVar10[1];
  *puVar10 = psVar12;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_978);
  local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_d58.field_2._M_allocated_capacity = *psVar12;
    local_d58.field_2._8_8_ = plVar9[3];
  }
  else {
    local_d58.field_2._M_allocated_capacity = *psVar12;
    local_d58._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_d58._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
    operator_delete((void *)local_978._0_8_);
  }
  if (local_c90.super_Transport._vptr_Transport !=
      (_func_int **)&local_c90.super_Transport.m_Type._M_string_length) {
    operator_delete(local_c90.super_Transport._vptr_Transport);
  }
  AvailableIpAddresses_abi_cxx11_();
  local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d98,"127.0.0.1","");
  if (local_ca8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_ca8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&local_d98);
  }
  if (iVar8 == 0) {
    transport::FileFStream::FileFStream((FileFStream *)local_978,comm);
    do {
      transport::FileFStream::Open((FileFStream *)local_978,&local_d18,Read,false,false);
      transport::FileFStream::Close((FileFStream *)local_978);
    } while( true );
  }
  uVar11 = Comm::BroadcastValue<unsigned_long>(comm,appID,0);
  *appID = uVar11;
  local_db8 = iVar8;
  if (0 < channelsPerRank) {
    paVar4 = &local_348[0].field_2;
    ppcVar3 = &local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    uVar16 = 0;
    do {
      std::operator+(local_660,"tcp://",&local_d98);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_660);
      puVar13 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_348[0].field_2._0_8_ = *puVar13;
        local_348[0].field_2._8_8_ = plVar9[3];
        local_348[0]._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_348[0].field_2._0_8_ = *puVar13;
        local_348[0]._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_348[0]._M_string_length = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar15 = *appID * 100 + (long)(iVar8 % 1000) * (ulong)(uint)channelsPerRank + (long)basePort +
               uVar16;
      cVar17 = '\x01';
      if (9 < uVar15) {
        uVar14 = uVar15;
        cVar6 = '\x04';
        do {
          cVar17 = cVar6;
          if (uVar14 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_003fa2e5;
          }
          if (uVar14 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_003fa2e5;
          }
          if (uVar14 < 10000) goto LAB_003fa2e5;
          bVar7 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar6 = cVar17 + '\x04';
        } while (bVar7);
        cVar17 = cVar17 + '\x01';
      }
LAB_003fa2e5:
      local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppcVar3;
      std::__cxx11::string::_M_construct((ulong)&local_dd8,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (uint)local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,uVar15);
      uVar18 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348[0]._M_dataplus._M_p != paVar4) {
        uVar18 = local_348[0].field_2._M_allocated_capacity;
      }
      pcVar2 = (pointer)(CONCAT44(local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish._4_4_,
                                  (uint)local_dd8.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_finish) +
                        local_348[0]._M_string_length);
      if ((ulong)uVar18 < pcVar2) {
        pcVar19 = (pointer)0xf;
        if ((pointer *)
            local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != ppcVar3) {
          pcVar19 = local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        if (pcVar19 < pcVar2) goto LAB_003fa35a;
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_dd8,0,(char *)0x0,
                                    (ulong)local_348[0]._M_dataplus._M_p);
      }
      else {
LAB_003fa35a:
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_348,
                                    (ulong)local_dd8.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
      }
      local_c90.super_Transport._vptr_Transport =
           (_func_int **)&local_c90.super_Transport.m_Type._M_string_length;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar9 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9 == pbVar1) {
        local_c90.super_Transport.m_Type._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        local_c90.super_Transport.m_Type.field_2._M_allocated_capacity = plVar9[3];
      }
      else {
        local_c90.super_Transport.m_Type._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        local_c90.super_Transport._vptr_Transport = (_func_int **)*plVar9;
      }
      local_c90.super_Transport.m_Type._M_dataplus._M_p = (pointer)plVar9[1];
      *plVar9 = (long)pbVar1;
      plVar9[1] = 0;
      *(value_t *)&(pbVar1->_M_dataplus)._M_p = null;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_c90);
      psVar12 = puVar10 + 2;
      if ((size_type *)*puVar10 == psVar12) {
        local_978._16_8_ = *psVar12;
        local_960[0]._0_8_ = puVar10[3];
        local_978._0_8_ = local_978 + 0x10;
      }
      else {
        local_978._16_8_ = *psVar12;
        local_978._0_8_ = (size_type *)*puVar10;
      }
      local_978._8_8_ = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      if (local_c90.super_Transport._vptr_Transport !=
          (_func_int **)&local_c90.super_Transport.m_Type._M_string_length) {
        operator_delete(local_c90.super_Transport._vptr_Transport);
      }
      if ((pointer *)
          local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != ppcVar3) {
        operator_delete(local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348[0]._M_dataplus._M_p != paVar4) {
        operator_delete(local_348[0]._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_660[0]._M_dataplus._M_p._1_7_,(char)local_660[0]._M_dataplus._M_p) !=
          &local_660[0].field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_660[0]._M_dataplus._M_p._1_7_,
                                 (char)local_660[0]._M_dataplus._M_p));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_db0,(value_type *)local_978);
      if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
        operator_delete((void *)local_978._0_8_);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)channelsPerRank);
  }
  local_cf8.m_type = null;
  local_cf8.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)2>::
  construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (&local_cf8,local_db0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(local_348,&local_cf8,-1,' ',false,strict);
  local_978._0_8_ = local_978._0_8_ & 0xffffffffffffff00;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_dd8,(long)(channelsPerRank << 6),local_978,(allocator_type *)&local_c90);
  memcpy(local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,local_348[0]._M_dataplus._M_p,local_348[0]._M_string_length);
  local_978._0_8_ = local_978._0_8_ & 0xffffffffffffff00;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_cc0,(long)(int)local_db4 * (long)channelsPerRank * 0x40,local_978,
             (allocator_type *)&local_c90);
  Comm::GatherArrays<char>
            (comm,local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,(long)(channelsPerRank << 6),
             local_cc0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  if (local_db8 == 0) {
    local_da8.m_type = null;
    local_da8.m_value.object = (object_t *)0x0;
    if (0 < (int)local_db4) {
      uVar16 = (ulong)local_db4;
      uVar15 = 0;
      do {
        local_978._0_8_ =
             local_cc0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + (long)channelsPerRank * 0x40 * uVar15;
        local_ce8._M_unused._M_object = (void *)0x0;
        local_ce8._8_8_ = 0;
        local_cd8 = (code *)0x0;
        uStack_cd0 = 0;
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::parse<char*>((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)local_660,(char **)local_978,(parser_callback_t *)&local_ce8,true,false);
        if (local_cd8 != (code *)0x0) {
          (*local_cd8)(&local_ce8,&local_ce8,__destroy_functor);
        }
        local_978._8_8_ = (_Rb_tree_node_base *)0x0;
        local_978._16_8_ = 0;
        local_960[0]._M_allocated_capacity = 0x8000000000000000;
        local_c90.super_Transport._vptr_Transport = (_func_int **)local_660;
        local_978._0_8_ = local_660;
        if ((char)local_660[0]._M_dataplus._M_p == '\0') {
          local_960[0]._M_allocated_capacity = 1;
LAB_003fa73e:
          local_c90.super_Transport.m_Type._M_dataplus._M_p = (pointer)0x0;
          local_c90.super_Transport.m_Type._M_string_length = 0;
          local_c90.super_Transport.m_Type.field_2._M_allocated_capacity = 1;
        }
        else if ((char)local_660[0]._M_dataplus._M_p == '\x02') {
          local_978._16_8_ = *(undefined8 *)local_660[0]._M_string_length;
          local_c90.super_Transport.m_Type._M_dataplus._M_p = (pointer)0x0;
          local_c90.super_Transport.m_Type.field_2._M_allocated_capacity = 0x8000000000000000;
          local_c90.super_Transport.m_Type._M_string_length =
               *(size_type *)(local_660[0]._M_string_length + 8);
        }
        else {
          if ((char)local_660[0]._M_dataplus._M_p != '\x01') {
            local_960[0]._M_allocated_capacity = 0;
            goto LAB_003fa73e;
          }
          local_978._8_8_ = *(size_type *)(local_660[0]._M_string_length + 0x18);
          local_c90.super_Transport.m_Type._M_string_length = 0;
          local_c90.super_Transport.m_Type.field_2._M_allocated_capacity = 0x8000000000000000;
          local_c90.super_Transport.m_Type._M_dataplus._M_p =
               (pointer)(local_660[0]._M_string_length + 8);
        }
        while( true ) {
          bVar7 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_978,
                             (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)&local_c90);
          if (bVar7) break;
          val = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_978);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::push_back(&local_da8,val);
          if (*(char *)local_978._0_8_ == '\x02') {
            local_978._16_8_ = local_978._16_8_ + 0x10;
          }
          else if (*(char *)local_978._0_8_ == '\x01') {
            local_978._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_978._8_8_);
          }
          else {
            local_960[0]._0_8_ = local_960[0]._M_allocated_capacity + 1;
          }
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_660);
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar16);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(local_660,&local_da8,-1,' ',false,strict);
    transport::FileFStream::FileFStream((FileFStream *)local_978,comm);
    transport::FileFStream::Open((FileFStream *)local_978,&local_d58,Write,false,false);
    transport::FileFStream::FileFStream(&local_c90,comm);
    transport::FileFStream::Open(&local_c90,&local_d78,Write,false,false);
    transport::FileFStream::Write
              (&local_c90,
               (char *)CONCAT71(local_660[0]._M_dataplus._M_p._1_7_,
                                (char)local_660[0]._M_dataplus._M_p),local_660[0]._M_string_length,
               0xffffffffffffffff);
    transport::FileFStream::Close(&local_c90);
    transport::FileFStream::Close((FileFStream *)local_978);
    remove(local_d58._M_dataplus._M_p);
    transport::FileFStream::~FileFStream(&local_c90);
    transport::FileFStream::~FileFStream((FileFStream *)local_978);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_660[0]._M_dataplus._M_p._1_7_,(char)local_660[0]._M_dataplus._M_p) !=
        &local_660[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_660[0]._M_dataplus._M_p._1_7_,
                               (char)local_660[0]._M_dataplus._M_p));
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_da8);
  }
  if (local_cc0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_cc0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_dd8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348[0]._M_dataplus._M_p != &local_348[0].field_2) {
    operator_delete(local_348[0]._M_dataplus._M_p);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_cf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
    operator_delete(local_d98._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ca8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
    operator_delete(local_d58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
    operator_delete(local_d78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p);
  }
  if (local_d38[0] != local_d28) {
    operator_delete(local_d38[0]);
  }
  return;
}

Assistant:

void HandshakeWriter(Comm const &comm, size_t &appID, std::vector<std::string> &fullAddresses,
                     const std::string &name, const std::string &engineName, const int basePort,
                     const int channelsPerRank, const int maxRanksPerNode, const int maxAppsPerNode)
{

    int mpiRank = comm.Rank();
    int mpiSize = comm.Size();

    const std::string globalFilename = ".socket";
    const std::string globalLockFilename = ".socket.lock";

    const std::string engineFilename = name + "." + engineName;
    const std::string engineLockFilename = name + "." + engineName + ".lock";

    // Get IP address
    auto ips = helper::AvailableIpAddresses();
    std::string ip = "127.0.0.1";
    if (ips.empty() == false)
    {
        ip = ips[0];
    }

    // Check total number of writer apps
    if (mpiRank == 0)
    {
        transport::FileFStream lockCheck(comm);
        while (true)
        {
            try
            {
                lockCheck.Open(globalLockFilename, Mode::Read);
                lockCheck.Close();
            }
            catch (...)
            {
                break;
            }
        }
        transport::FileFStream lockWrite(comm);
        lockWrite.Open(globalLockFilename, Mode::Write);

        transport::FileFStream numRead(comm);
        try
        {
            numRead.Open(globalFilename, Mode::Read);
            auto size = numRead.GetSize();
            std::vector<char> numAppsChar(size);
            numRead.Read(numAppsChar.data(), numAppsChar.size());
            appID = 1 + stoi(std::string(numAppsChar.begin(), numAppsChar.end()));
            numRead.Close();
        }
        catch (...)
        {
        }
        transport::FileFStream numWrite(comm);
        numWrite.Open(globalFilename, Mode::Write);
        std::string numAppsString = std::to_string(appID);
        numWrite.Write(numAppsString.data(), numAppsString.size());
        numWrite.Close();

        lockWrite.Close();
        remove(globalLockFilename.c_str());
    }

    appID = comm.BroadcastValue(appID);

    // Make full addresses
    for (int i = 0; i < channelsPerRank; ++i)
    {
        std::string addr =
            "tcp://" + ip + ":" +
            std::to_string(basePort + (100 * appID) +
                           (mpiRank % 1000) * static_cast<unsigned long>(channelsPerRank) + i) +
            "\0";
        fullAddresses.push_back(addr);
    }
    nlohmann::json localAddressesJson = fullAddresses;
    std::string localAddressesStr = localAddressesJson.dump();
    std::vector<char> localAddressesChar(64 * channelsPerRank, '\0');
    std::memcpy(localAddressesChar.data(), localAddressesStr.c_str(), localAddressesStr.size());
    std::vector<char> globalAddressesChar(static_cast<size_t>(64) * channelsPerRank * mpiSize,
                                          '\0');
    comm.GatherArrays(localAddressesChar.data(), 64 * channelsPerRank, globalAddressesChar.data());

    // Writing handshake file
    if (mpiRank == 0)
    {
        nlohmann::json globalAddressesJson;
        for (int i = 0; i < mpiSize; ++i)
        {
            auto j = nlohmann::json::parse(
                &globalAddressesChar[static_cast<size_t>(i) * static_cast<size_t>(64) *
                                     static_cast<size_t>(channelsPerRank)]);
            for (auto &i : j)
            {
                globalAddressesJson.push_back(i);
            }
        }
        std::string globalAddressesStr = globalAddressesJson.dump();
        transport::FileFStream lockstream(comm);
        lockstream.Open(engineLockFilename, Mode::Write);
        transport::FileFStream ipstream(comm);
        ipstream.Open(engineFilename, Mode::Write);
        ipstream.Write(globalAddressesStr.data(), globalAddressesStr.size());
        ipstream.Close();
        lockstream.Close();
        remove(engineLockFilename.c_str());
    }
}